

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSContext * JS_GetFunctionRealm(JSContext *ctx,JSValue func_obj)

{
  JSValue func_obj_00;
  JSValue func_obj_01;
  int in_EDX;
  JSContext *in_RSI;
  JSValueUnion in_RDI;
  JSBoundFunction *bf;
  JSProxyData *s;
  JSFunctionBytecode *b;
  JSContext *realm;
  JSObject *p;
  JSValueUnion local_30;
  
  if (in_EDX != -1) {
    return (JSContext *)in_RDI.float64;
  }
  switch((in_RSI->header).dummy2) {
  case 0xc:
    local_30 = (JSValueUnion)*(JSValueUnion *)&in_RSI->binary_object_count;
    break;
  case 0xd:
  case 0x10:
  case 0x2d:
  case 0x31:
    local_30 = (JSValueUnion)
               ((JSValueUnion *)(*(long *)&in_RSI->binary_object_count + 0x48))->float64;
    break;
  case 0xe:
    func_obj_01.tag = (int64_t)in_RSI;
    func_obj_01.u.ptr = in_RDI.ptr;
    local_30.ptr = JS_GetFunctionRealm(in_RSI,func_obj_01);
    break;
  default:
    local_30 = in_RDI;
    break;
  case 0x29:
    if (*(long *)&in_RSI->binary_object_count == 0) {
      return (JSContext *)in_RDI.float64;
    }
    if (*(char *)(*(long *)&in_RSI->binary_object_count + 0x21) != '\0') {
      JS_ThrowTypeErrorRevokedProxy((JSContext *)0x164a85);
      return (JSContext *)0x0;
    }
    func_obj_00.tag = (int64_t)in_RSI;
    func_obj_00.u.ptr = in_RDI.ptr;
    local_30.ptr = JS_GetFunctionRealm(in_RSI,func_obj_00);
  }
  return (JSContext *)local_30.float64;
}

Assistant:

static JSContext *JS_GetFunctionRealm(JSContext *ctx, JSValueConst func_obj)
{
    JSObject *p;
    JSContext *realm;
    
    if (JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT)
        return ctx;
    p = JS_VALUE_GET_OBJ(func_obj);
    switch(p->class_id) {
    case JS_CLASS_C_FUNCTION:
        realm = p->u.cfunc.realm;
        break;
    case JS_CLASS_BYTECODE_FUNCTION:
    case JS_CLASS_GENERATOR_FUNCTION:
    case JS_CLASS_ASYNC_FUNCTION:
    case JS_CLASS_ASYNC_GENERATOR_FUNCTION:
        {
            JSFunctionBytecode *b;
            b = p->u.func.function_bytecode;
            realm = b->realm;
        }
        break;
    case JS_CLASS_PROXY:
        {
            JSProxyData *s = p->u.opaque;
            if (!s)
                return ctx;
            if (s->is_revoked) {
                JS_ThrowTypeErrorRevokedProxy(ctx);
                return NULL;
            } else {
                realm = JS_GetFunctionRealm(ctx, s->target);
            }
        }
        break;
    case JS_CLASS_BOUND_FUNCTION:
        {
            JSBoundFunction *bf = p->u.bound_function;
            realm = JS_GetFunctionRealm(ctx, bf->func_obj);
        }
        break;
    default:
        realm = ctx;
        break;
    }
    return realm;
}